

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
wasm::IntervalProcessor::filterOverlaps
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<wasm::Interval,_std::allocator<wasm::Interval>_> *intervals)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer pIVar6;
  pointer pIVar7;
  ulong uVar8;
  pair<wasm::Interval,_int> *candidate;
  undefined1 auVar9 [8];
  undefined1 auStack_68 [8];
  vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
  intIntervals;
  undefined1 auStack_48 [8];
  vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_> kept;
  
  pIVar7 = (intervals->super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar6 = (intervals->super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pIVar6 == pIVar7) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    intIntervals.
    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_68 = (undefined1  [8])0x0;
    intIntervals.
    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uVar8 = 0;
    while( true ) {
      if ((ulong)(((long)pIVar6 - (long)pIVar7) / 0xc) <= uVar8) break;
      auStack_48 = *(undefined1 (*) [8])(pIVar7 + uVar8);
      kept.
      super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44((int)uVar8,pIVar7[uVar8].weight)
      ;
      std::vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>::
      emplace_back<std::pair<wasm::Interval,int>>
                ((vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>
                  *)auStack_68,(pair<wasm::Interval,_int> *)auStack_48);
      uVar8 = (ulong)((int)uVar8 + 1);
      pIVar7 = (intervals->super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pIVar6 = (intervals->super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<wasm::Interval,int>*,std::vector<std::pair<wasm::Interval,int>,std::allocator<std::pair<wasm::Interval,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auStack_68,
               intIntervals.
               super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,((long)pIVar6 - (long)pIVar7) % 0xc);
    auStack_48 = (undefined1  [8])0x0;
    kept.
    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    kept.
    super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
    push_back((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
               *)auStack_48,(value_type *)auStack_68);
    ppVar4 = intIntervals.
             super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (auVar9 = auStack_68;
        ppVar5 = kept.
                 super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, auVar9 != (undefined1  [8])ppVar4;
        auVar9 = (undefined1  [8])((long)auVar9 + 0x10)) {
      uVar1 = kept.
              super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1].first.end;
      if ((((value_type *)auVar9)->first).start < uVar1) {
        uVar2 = kept.
                super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].first.weight;
        uVar3 = (((value_type *)auVar9)->first).weight;
        if ((uVar2 == uVar3 && (((value_type *)auVar9)->first).end < uVar1) || (uVar2 < uVar3)) {
          kept.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start[-1].first.weight =
               (((value_type *)auVar9)->first).weight;
          uVar1 = (((value_type *)auVar9)->first).end;
          kept.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start[-1].first.start =
               (((value_type *)auVar9)->first).start;
          kept.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start[-1].first.end = uVar1;
          kept.
          super__Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start[-1].second = ((value_type *)auVar9)->second;
        }
      }
      else {
        std::
        vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
        push_back((vector<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                   *)auStack_48,(value_type *)auVar9);
      }
    }
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (auVar9 = auStack_48; auVar9 != (undefined1  [8])ppVar5;
        auVar9 = (undefined1  [8])((long)auVar9 + 0x10)) {
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,&((pointer)auVar9)->second);
    }
    std::
    _Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
    ~_Vector_base((_Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                   *)auStack_48);
    std::
    _Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>::
    ~_Vector_base((_Vector_base<std::pair<wasm::Interval,_int>,_std::allocator<std::pair<wasm::Interval,_int>_>_>
                   *)auStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
IntervalProcessor::filterOverlaps(std::vector<Interval>& intervals) {
  if (intervals.size() == 0) {
    return std::vector<int>();
  }

  std::vector<std::pair<Interval, int>> intIntervals;
  for (Index i = 0; i < intervals.size(); i++) {
    auto& interval = intervals[i];
    intIntervals.push_back({interval, i});
  }

  std::sort(intIntervals.begin(), intIntervals.end());

  std::vector<std::pair<Interval, int>> kept;
  kept.push_back(intIntervals[0]);
  for (auto& candidate : intIntervals) {
    auto& former = kept.back();
    if (former.first.end <= candidate.first.start) {
      kept.push_back(candidate);
      continue;
    }

    // When two intervals overlap with the same weight, prefer to keep the
    // interval that ends sooner under the presumption that it will overlap with
    // fewer subsequent intervals.
    if (former.first.weight == candidate.first.weight &&
        former.first.end > candidate.first.end) {
      former = candidate;
    } else if (former.first.weight < candidate.first.weight) {
      former = candidate;
    }
  }

  std::vector<int> result;
  for (auto& intPair : kept) {
    result.push_back(intPair.second);
  }

  return result;
}